

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,16ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  bool bVar1;
  basic_string<char> *pbVar2;
  
  bVar1 = basic_string<char>::operator<
                    ((basic_string<char> *)(first + 0x70),*(basic_string<char> **)this);
  if (bVar1) {
    pbVar2 = doitfirst<frozen::basic_string<char>const*,8ul>(this,first + 0x80);
    return pbVar2;
  }
  pbVar2 = doit_fast<frozen::basic_string<char>const*,7ul>(this,first);
  return pbVar2;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }